

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Start_Interactor(Am_Object *inter,Am_Object *start_obj,Am_Input_Char start_char,
                        Am_Object *start_window,int start_x,int start_y,bool update_now)

{
  anon_union_8_8_ea4c8939_for_value *value;
  bool bVar1;
  Am_Inter_State AVar2;
  Am_Wrapper *pAVar3;
  Am_Value *pAVar4;
  undefined1 local_b0 [8];
  Am_Inter_Internal_Method method;
  Am_Input_Event ev;
  Am_Object local_60;
  Am_Object local_58 [3];
  Am_Object local_40;
  Am_Inter_State local_38;
  byte local_31;
  Am_Inter_State state;
  int iStack_2c;
  bool update_now_local;
  int start_y_local;
  int start_x_local;
  Am_Object *start_window_local;
  Am_Object *start_obj_local;
  Am_Object *inter_local;
  Am_Input_Char start_char_local;
  
  local_31 = update_now;
  state = start_y;
  iStack_2c = start_x;
  _start_y_local = start_window;
  start_window_local = start_obj;
  start_obj_local = inter;
  inter_local._4_4_ = start_char;
  Am_Object::Am_Object(&local_40,inter);
  AVar2 = Am_Get_Inter_State(&local_40);
  Am_Object::~Am_Object(&local_40);
  if (AVar2 == Am_INTER_WAITING) {
    local_38 = AVar2;
    Am_Object::Am_Object(local_58,inter);
    Check_And_Handle_Trace_Next_Inter(local_58);
    Am_Object::~Am_Object(local_58);
    bVar1 = Am_Object::Valid(start_obj);
    if (!bVar1) {
      Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)inter);
      Am_Object::operator=(start_obj,&local_60);
      Am_Object::~Am_Object(&local_60);
    }
    bVar1 = Am_Object::Valid(start_window);
    if ((!bVar1) && (bVar1 = Am_Object::Valid(start_obj), bVar1)) {
      pAVar4 = Am_Object::Get(start_obj,0x68,0);
      Am_Object::operator=(start_window,pAVar4);
      bVar1 = Am_Object::Valid(start_window);
      if ((!bVar1) ||
         (bVar1 = Am_Translate_Coordinates
                            (start_obj,0,0,start_window,&stack0xffffffffffffffd4,(int *)&state),
         !bVar1)) {
        pAVar4 = Am_Object::Get(start_obj,100,0);
        iStack_2c = Am_Value::operator_cast_to_int(pAVar4);
        pAVar4 = Am_Object::Get(start_obj,0x65,0);
        state = Am_Value::operator_cast_to_int(pAVar4);
      }
    }
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(start_window);
    Am_Object::Set(inter,0x68,pAVar3,0);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(start_obj);
    Am_Object::Set(inter,0x11a,pAVar3,0);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(start_obj);
    Am_Object::Set(inter,0x119,pAVar3,0);
    value = &ev.user_id.value;
    Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&value->float_value);
    Am_Object::Set(inter,0x11b,(Am_Value *)value,0);
    Am_Value::~Am_Value((Am_Value *)&ev.user_id.value);
    Am_Object::Set(inter,0x11f,iStack_2c,0);
    Am_Object::Set(inter,0x120,state,0);
    Am_Input_Event::Am_Input_Event((Am_Input_Event *)&method.Call);
    Am_Input_Char::operator=
              ((Am_Input_Char *)&method.Call,(Am_Input_Char *)((long)&inter_local + 4));
    ev.draw._0_4_ = iStack_2c;
    ev.draw._4_4_ = state;
    ev.input_char = (Am_Input_Char)0x0;
    ev._4_4_ = 0;
    ev.x = 0;
    ev.y = 0;
    Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)local_b0);
    pAVar4 = Am_Object::Get(inter,0xbe,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)local_b0,pAVar4);
    (*(code *)method.from_wrapper)(inter,start_obj,start_window,&method.Call);
    if ((local_31 & 1) != 0) {
      do_update();
    }
    Am_Input_Event::~Am_Input_Event((Am_Input_Event *)&method.Call);
  }
  return;
}

Assistant:

void
Am_Start_Interactor(Am_Object inter, Am_Object start_obj,
                    Am_Input_Char start_char, Am_Object start_window,
                    int start_x, int start_y, bool update_now)
{

  Am_Inter_State state = Am_Get_Inter_State(inter);
  if (state != Am_INTER_WAITING)
    return;

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly Starting " << inter);
  Check_And_Handle_Trace_Next_Inter(inter);
  if (!start_obj.Valid())
    start_obj = inter.Get_Owner();
  if (!start_window.Valid() && start_obj.Valid()) {
    start_window = start_obj.Get(Am_WINDOW);
    if (start_window.Valid() &&
        Am_Translate_Coordinates(start_obj, 0, 0, start_window, start_x,
                                 start_y))
      //then have pos of start_obj in start_window
      ;
    else {
      start_x = start_obj.Get(Am_LEFT);
      start_y = start_obj.Get(Am_TOP);
    }
  }
  //now start the interactor
  inter.Set(Am_WINDOW, start_window);
  inter.Set(Am_START_OBJECT, start_obj);
  inter.Set(Am_CURRENT_OBJECT, start_obj);
  inter.Set(Am_START_CHAR, start_char);
  inter.Set(Am_FIRST_X, start_x);
  inter.Set(Am_FIRST_Y, start_y);
  Am_Input_Event ev;
  ev.input_char = start_char;
  ev.x = start_x;
  ev.y = start_y;
  ev.draw = nullptr;
  ev.time_stamp = 0;
  Am_Inter_Internal_Method method;
  method = inter.Get(Am_INTER_START_METHOD);
  method.Call(inter, start_obj, start_window, &ev);
  if (update_now)
    do_update();
}